

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttable.cc
# Opt level: O3

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
* __thiscall
upb::generator::FastDecodeTable_abi_cxx11_
          (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *__return_storage_ptr__,generator *this,MessageDefPtr message,DefPoolPair *pools)

{
  uint8_t uVar1;
  ushort uVar2;
  FieldDefPtr field;
  ulong __val;
  bool bVar3;
  long lVar4;
  undefined8 *puVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  uint32_t uVar9;
  upb_CType uVar10;
  ulong uVar11;
  uint64_t uVar12;
  MessageDefPtr MVar13;
  upb_MiniTable *puVar14;
  upb_MiniTableField *puVar15;
  upb_OneofDef *puVar16;
  upb_MessageDef *m;
  upb_FileDef *puVar17;
  upb_FileDef *puVar18;
  ulong *puVar19;
  char *pcVar20;
  ulong uVar21;
  pointer ppVar22;
  char cVar23;
  anon_union_8_7_dbb01f68_for_defaultval aVar24;
  __normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
  __i;
  size_type sVar25;
  long lVar26;
  undefined8 *puVar27;
  pointer ppVar28;
  uint uVar29;
  string *psVar30;
  initializer_list<unsigned_long> __l;
  string size_ceil;
  string __str;
  TableEntry ent;
  string cardinality;
  string type;
  vector<unsigned_long,_std::allocator<unsigned_long>_> breaks;
  char *local_178;
  undefined8 local_170;
  char local_168;
  undefined1 uStack_167;
  undefined1 uStack_166;
  undefined1 uStack_165;
  undefined4 uStack_164;
  undefined1 local_158 [32];
  unsigned_long local_138;
  char *local_130;
  undefined8 local_128;
  char *local_120;
  anon_union_8_7_dbb01f68_for_defaultval local_118;
  undefined8 *puStack_110;
  long local_108;
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  ulong local_d8;
  undefined1 *local_d0;
  upb_FieldDef *local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  anon_union_8_2_9eb4e620_for_upb_Message_0 *local_b0;
  size_type local_a8;
  anon_union_8_2_9eb4e620_for_upb_Message_0 local_a0 [2];
  uint64_t local_90;
  upb_MessageDef *local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  ulong local_48;
  undefined8 *local_40;
  anon_union_8_7_dbb01f68_for_defaultval local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108 = 0;
  local_118.sint = 0;
  puStack_110 = (undefined8 *)0x0;
  local_88 = message.ptr_;
  iVar8 = upb_MessageDef_FieldCount((upb_MessageDef *)this);
  std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::reserve
            ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)&local_118,(long)iVar8);
  if (iVar8 != 0) {
    sVar25 = 0;
    do {
      local_158._0_8_ = upb_MessageDef_Field((upb_MessageDef *)this,(int)sVar25);
      std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::
      emplace_back<upb::FieldDefPtr>
                ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)&local_118,
                 (FieldDefPtr *)local_158);
      sVar25 = sVar25 + 1;
    } while ((long)iVar8 != sVar25);
  }
  puVar5 = puStack_110;
  aVar24 = local_118;
  if ((undefined8 *)local_118.sint != puStack_110) {
    lVar26 = (long)puStack_110 - (long)local_118;
    uVar11 = lVar26 >> 3;
    lVar4 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<upb::FieldDefPtr*,std::vector<upb::FieldDefPtr,std::allocator<upb::FieldDefPtr>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<upb::generator::(anonymous_namespace)::FieldHotnessOrder(upb::MessageDefPtr)::_lambda(upb::FieldDefPtr,upb::FieldDefPtr)_1_>>
              (local_118.sint,puStack_110,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar26 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<upb::FieldDefPtr*,std::vector<upb::FieldDefPtr,std::allocator<upb::FieldDefPtr>>>,__gnu_cxx::__ops::_Iter_comp_iter<upb::generator::(anonymous_namespace)::FieldHotnessOrder(upb::MessageDefPtr)::_lambda(upb::FieldDefPtr,upb::FieldDefPtr)_1_>>
                (aVar24.sint,puVar5);
    }
    else {
      puVar27 = (undefined8 *)(aVar24.sint + 0x80);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<upb::FieldDefPtr*,std::vector<upb::FieldDefPtr,std::allocator<upb::FieldDefPtr>>>,__gnu_cxx::__ops::_Iter_comp_iter<upb::generator::(anonymous_namespace)::FieldHotnessOrder(upb::MessageDefPtr)::_lambda(upb::FieldDefPtr,upb::FieldDefPtr)_1_>>
                (aVar24.sint,puVar27);
      for (; puVar27 != puVar5; puVar27 = puVar27 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<upb::FieldDefPtr*,std::vector<upb::FieldDefPtr,std::allocator<upb::FieldDefPtr>>>,__gnu_cxx::__ops::_Val_comp_iter<upb::generator::(anonymous_namespace)::FieldHotnessOrder(upb::MessageDefPtr)::_lambda(upb::FieldDefPtr,upb::FieldDefPtr)_1_>>
                  (puVar27);
      }
    }
  }
  local_40 = puStack_110;
  aVar24 = local_118;
  if ((undefined8 *)local_118.sint == puStack_110) {
LAB_0010bfc4:
    if ((undefined8 *)local_118.sint != (undefined8 *)0x0) {
      operator_delete(local_118.msg,local_108 - (long)local_118);
    }
    return __return_storage_ptr__;
  }
LAB_0010b843:
  local_f8 = &local_e8;
  field.ptr_ = *aVar24.msg;
  local_f0 = 0;
  local_e8 = 0;
  local_d8 = 0;
  local_38 = aVar24;
  uVar12 = anon_unknown_0::GetEncodedTag(field);
  if (uVar12 < 0x8000) {
    MVar13.ptr_ = upb_FieldDef_ContainingType(field.ptr_);
    puVar14 = DefPoolPair::GetMiniTable64((DefPoolPair *)local_88,MVar13);
    uVar9 = upb_FieldDef_Number(field.ptr_);
    puVar15 = upb_MiniTable_FindFieldByNumber(puVar14,uVar9);
    local_b0 = local_a0;
    local_a8 = 0;
    local_a0[0].internal_opaque._0_1_ = 0;
    local_d0 = &local_c0;
    local_c8 = (upb_FieldDef *)0x0;
    local_c0 = 0;
    uVar1 = puVar15->descriptortype_dont_copy_me__upb_internal_use_only;
    if ((puVar15->mode_dont_copy_me__upb_internal_use_only & 0x10) != 0) {
      pcVar20 = "v4";
      if (uVar1 != '\x05') {
        if (uVar1 != '\f') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/mini_table/internal/field.h"
                        ,0x7b,
                        "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)");
        }
        pcVar20 = "s";
      }
LAB_0010b961:
      std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)0x0,(ulong)pcVar20);
      bVar7 = puVar15->mode_dont_copy_me__upb_internal_use_only & 3;
      if (bVar7 == 2) {
        pcVar20 = "s";
        if (puVar15->presence < 0) {
          pcVar20 = "o";
        }
      }
      else {
        if (bVar7 != 1) goto LAB_0010bb68;
        pcVar20 = "p";
        if ((puVar15->mode_dont_copy_me__upb_internal_use_only & 4) == 0) {
          pcVar20 = "r";
        }
      }
      std::__cxx11::string::_M_replace((ulong)&local_d0,0,(char *)local_c8,(ulong)pcVar20);
      local_90 = anon_unknown_0::GetEncodedTag(field);
      uVar29._0_2_ = puVar15->offset_dont_copy_me__upb_internal_use_only;
      uVar29._2_2_ = puVar15->presence;
      upb_FieldDef_IsRepeated(field.ptr_);
      puVar16 = upb_FieldDef_RealContainingOneof(field.ptr_);
      uVar2 = puVar15->presence;
      uVar11 = (ulong)uVar2;
      if (puVar16 == (upb_OneofDef *)0x0) {
        if (uVar11 == 0) {
          uVar11 = 0x3f;
        }
        else if (0x1f < uVar2) goto LAB_0010bb68;
        uVar11 = uVar11 << 0x18;
      }
      else {
        if ((-1 < (short)uVar2) || (uVar9 = upb_FieldDef_Number(field.ptr_), 0xff < uVar9))
        goto LAB_0010bb68;
        uVar9 = upb_FieldDef_Number(field.ptr_);
        uVar11 = (ulong)CONCAT24(uVar2,uVar9 << 0x18) ^ 0xffff00000000;
      }
      uVar10 = upb_FieldDef_CType(field.ptr_);
      uVar11 = uVar11 | local_90 | (ulong)uVar29 << 0x30;
      if (uVar10 == kUpb_CType_Message) {
        if (0xff < (ulong)puVar15->submsg_index_dont_copy_me__upb_internal_use_only)
        goto LAB_0010bb68;
        local_178 = &local_168;
        uStack_166 = 0x78;
        local_168 = 'm';
        uStack_167 = 0x61;
        local_170 = 3;
        uStack_165 = 0;
        local_48 = (ulong)puVar15->submsg_index_dont_copy_me__upb_internal_use_only;
        m = upb_FieldDef_MessageSubDef(field.ptr_);
        puVar17 = upb_MessageDef_File(m);
        puVar18 = upb_FieldDef_File(field.ptr_);
        uVar21 = 0xffffffffffffffff;
        if (puVar17 == puVar18) {
          MVar13.ptr_ = upb_FieldDef_MessageSubDef(field.ptr_);
          puVar14 = DefPoolPair::GetMiniTable64((DefPoolPair *)local_88,MVar13);
          uVar21 = (ulong)puVar14->size_dont_copy_me__upb_internal_use_only + 8;
        }
        local_158._16_8_ = 0xc0;
        local_158._24_8_ = 0x100;
        local_158._0_8_ = (upb_FieldDef *)0x40;
        local_158._8_8_ = 0x80;
        __l._M_len = 4;
        __l._M_array = (iterator)local_158;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_60,__l,(allocator_type *)&local_80);
        for (puVar19 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            puVar19 !=
            local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish; puVar19 = puVar19 + 1) {
          __val = *puVar19;
          if (uVar21 <= __val) {
            cVar23 = '\x01';
            if (__val < 10) goto LAB_0010be34;
            uVar21 = __val;
            cVar6 = '\x04';
            goto LAB_0010bded;
          }
        }
        goto LAB_0010be7b;
      }
      local_130 = "1";
      if (0xff < local_90) {
        local_130 = "2";
      }
      local_170 = 0;
      local_168 = '\0';
      local_158._0_8_ = local_c8;
      local_158._8_8_ = local_d0;
      local_158._16_8_ = local_a8;
      local_158._24_8_ = local_b0;
      local_138 = 1;
      local_178 = &local_168;
      absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
                (&local_178,0xe,"upb_p$0$1_$2bt",local_158,3);
      std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_178);
      if (local_178 != &local_168) {
        operator_delete(local_178,
                        CONCAT44(uStack_164,
                                 CONCAT13(uStack_165,
                                          CONCAT12(uStack_166,CONCAT11(uStack_167,local_168)))) + 1)
        ;
      }
      goto LAB_0010bfaf;
    }
    bVar7 = uVar1 - 1;
    if ((bVar7 < 0x12) && ((0x3ddffU >> (bVar7 & 0x1f) & 1) != 0)) {
      pcVar20 = &DAT_00128900 + *(int *)(&DAT_00128900 + (ulong)bVar7 * 4);
      goto LAB_0010b961;
    }
LAB_0010bb68:
    bVar3 = false;
    goto LAB_0010bb6a;
  }
  goto LAB_0010bcd3;
  while( true ) {
    if (uVar21 < 10000) goto LAB_0010be34;
    bVar3 = uVar21 < 100000;
    uVar21 = uVar21 / 10000;
    cVar6 = cVar23 + '\x04';
    if (bVar3) break;
LAB_0010bded:
    cVar23 = cVar6;
    if (uVar21 < 100) {
      cVar23 = cVar23 + -2;
      goto LAB_0010be34;
    }
    if (uVar21 < 1000) {
      cVar23 = cVar23 + -1;
      goto LAB_0010be34;
    }
  }
  cVar23 = cVar23 + '\x01';
LAB_0010be34:
  local_158._0_8_ = (upb_FieldDef *)(local_158 + 0x10);
  std::__cxx11::string::_M_construct((ulong)local_158,cVar23);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_158._0_8_,local_158._8_4_,__val);
  std::__cxx11::string::operator=((string *)&local_178,(string *)local_158);
  if ((upb_FieldDef *)local_158._0_8_ != (upb_FieldDef *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
LAB_0010be7b:
  local_130 = "1";
  if (0xff < local_90) {
    local_130 = "2";
  }
  local_78 = 0;
  local_70 = 0;
  local_158._0_8_ = local_c8;
  local_158._8_8_ = local_d0;
  local_158._16_8_ = local_a8;
  local_158._24_8_ = local_b0;
  local_138 = 1;
  local_128 = local_170;
  local_120 = local_178;
  local_80 = &local_70;
  absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
            ((string *)&local_80,0x15,"upb_p$0$1_$2bt_max$3b",local_158,4);
  std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_80);
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ulong *)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,
                    CONCAT44(uStack_164,
                             CONCAT13(uStack_165,CONCAT12(uStack_166,CONCAT11(uStack_167,local_168))
                                     )) + 1);
  }
  uVar11 = uVar11 | (uint)((int)local_48 << 0x10);
LAB_0010bfaf:
  bVar3 = true;
  local_d8 = uVar11;
LAB_0010bb6a:
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,CONCAT71(local_a0[0].internal_opaque._1_7_,
                                      (undefined1)local_a0[0].internal_opaque) + 1);
  }
  if (bVar3) {
    uVar29 = (uint)(uVar12 >> 3) & 0x1f;
    uVar21 = (ulong)uVar29;
    ppVar28 = (__return_storage_ptr__->
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppVar22 = (__return_storage_ptr__->
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar11 = ((long)ppVar22 - (long)ppVar28 >> 3) * -0x3333333333333333;
    if (uVar11 < uVar21 || uVar11 - uVar21 == 0) {
      do {
        local_158._0_8_ = local_158 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_158,"_upb_FastDecoder_DecodeGeneric","");
        sVar25 = uVar11 * 2;
        if (ppVar22 == ppVar28) {
          sVar25 = 1;
        }
        local_138 = 0;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::resize(__return_storage_ptr__,sVar25,(value_type *)local_158);
        if ((upb_FieldDef *)local_158._0_8_ != (upb_FieldDef *)(local_158 + 0x10)) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        }
        ppVar28 = (__return_storage_ptr__->
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ppVar22 = (__return_storage_ptr__->
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        uVar11 = ((long)ppVar22 - (long)ppVar28 >> 3) * -0x3333333333333333;
      } while (uVar11 < uVar21 || uVar11 - uVar21 == 0);
    }
    iVar8 = std::__cxx11::string::compare((char *)(ppVar28 + uVar21));
    if (iVar8 == 0) {
      psVar30 = (string *)
                ((long)&(((__return_storage_ptr__->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
                (ulong)(uVar29 * 0x28));
      std::__cxx11::string::_M_assign(psVar30);
      *(ulong *)(psVar30 + 0x20) = local_d8;
    }
  }
LAB_0010bcd3:
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
  }
  aVar24 = (anon_union_8_7_dbb01f68_for_defaultval)(local_38.str)->str;
  if ((local_38.str)->str == (char *)local_40) goto LAB_0010bfc4;
  goto LAB_0010b843;
}

Assistant:

std::vector<TableEntry> FastDecodeTable(upb::MessageDefPtr message,
                                        const DefPoolPair& pools) {
  std::vector<TableEntry> table;
  for (const auto field : FieldHotnessOrder(message)) {
    TableEntry ent;
    int slot = GetTableSlot(field);
    // std::cerr << "table slot: " << field->number() << ": " << slot << "\n";
    if (slot < 0) {
      // Tag can't fit in the table.
      continue;
    }
    if (!TryFillTableEntry(pools, field, ent)) {
      // Unsupported field type or offset, hasbit index, etc. doesn't fit.
      continue;
    }
    while ((size_t)slot >= table.size()) {
      size_t size = std::max(static_cast<size_t>(1), table.size() * 2);
      table.resize(size, TableEntry{"_upb_FastDecoder_DecodeGeneric", 0});
    }
    if (table[slot].first != "_upb_FastDecoder_DecodeGeneric") {
      // A hotter field already filled this slot.
      continue;
    }
    table[slot] = ent;
  }
  return table;
}